

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

bool comma(char **p)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = *p;
  cVar1 = *pcVar2;
  while ((byte)(cVar1 - 1U) < 0x20) {
    pcVar2 = pcVar2 + 1;
    *p = pcVar2;
    cVar1 = *pcVar2;
  }
  if ((cVar1 == ',') && (pcVar2[1] != ',')) {
    *p = pcVar2 + 1;
    return true;
  }
  return false;
}

Assistant:

bool comma(char*& p) {
	SkipBlanks(p);
	if (',' != p[0] || ',' == p[1]) return false;	// detect double-comma as FALSE state
	++p;
	return true;
}